

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall google::protobuf::internal::EpsCopyInputStream::Next(EpsCopyInputStream *this)

{
  char *pcVar1;
  LogMessage *pLVar2;
  int *piVar3;
  int local_54;
  EpsCopyInputStream *local_50;
  char *p;
  byte local_31;
  LogMessage local_30;
  Voidify local_19;
  EpsCopyInputStream *local_18;
  EpsCopyInputStream *this_local;
  
  local_31 = 0;
  local_18 = this;
  if (this->limit_ < 0x11) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
               ,0x9b,"limit_ > kSlopBytes");
    local_31 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar2);
  }
  if ((local_31 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  local_50 = (EpsCopyInputStream *)NextBuffer<false>(this,0,-1);
  if (local_50 == (EpsCopyInputStream *)0x0) {
    this->limit_end_ = this->buffer_end_;
    SetEndOfStream(this);
    this_local = (EpsCopyInputStream *)0x0;
  }
  else {
    this->limit_ = this->limit_ - ((int)this->buffer_end_ - (int)local_50);
    pcVar1 = this->buffer_end_;
    local_54 = 0;
    piVar3 = std::min<int>(&local_54,&this->limit_);
    this->limit_end_ = pcVar1 + *piVar3;
    this_local = local_50;
  }
  return (char *)this_local;
}

Assistant:

const char* EpsCopyInputStream::Next() {
  ABSL_DCHECK(limit_ > kSlopBytes);
  auto p = NextBuffer</*kExperimentalV2=*/false>(0 /* immaterial */, -1);
  if (p == nullptr) {
    limit_end_ = buffer_end_;
    // Distinguish ending on a pushed limit or ending on end-of-stream.
    SetEndOfStream();
    return nullptr;
  }
  limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return p;
}